

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall CGraphics_Threaded::TilesetFallbackSystem(CGraphics_Threaded *this,int TextureIndex)

{
  int iVar1;
  int in_ESI;
  CGraphics_Threaded *in_RDI;
  int NewTextureArrayIndex;
  
  iVar1 = (*in_RDI->m_pBackend->_vptr_IGraphicsBackend[5])();
  iVar1 = in_ESI / (int)(0x100 / (long)iVar1);
  if (in_RDI->m_TextureArrayIndex == -1) {
    in_RDI->m_TextureArrayIndex = iVar1;
  }
  else if (in_RDI->m_TextureArrayIndex != iVar1) {
    FlushVertices(in_RDI);
    in_RDI->m_TextureArrayIndex = iVar1;
  }
  return;
}

Assistant:

void CGraphics_Threaded::TilesetFallbackSystem(int TextureIndex)
{
	int NewTextureArrayIndex = TextureIndex / (256 / m_pBackend->GetTextureArraySize());
	if(m_TextureArrayIndex == -1)
		m_TextureArrayIndex = NewTextureArrayIndex;
	else if(m_TextureArrayIndex != NewTextureArrayIndex)
	{
		// have to switch the texture index
		FlushVertices();
		m_TextureArrayIndex = NewTextureArrayIndex;
	}
}